

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O0

ScanStatus * __thiscall
AmstradCPC::CRTCBusHandler::get_scaled_scan_status
          (ScanStatus *__return_storage_ptr__,CRTCBusHandler *this)

{
  ScanStatus local_38;
  CRTCBusHandler *local_10;
  CRTCBusHandler *this_local;
  
  local_10 = this;
  Outputs::CRT::CRT::get_scaled_scan_status(&local_38,&this->crt_);
  Outputs::Display::ScanStatus::operator/(__return_storage_ptr__,&local_38,4.0);
  return __return_storage_ptr__;
}

Assistant:

Outputs::Display::ScanStatus get_scaled_scan_status() const {
			return crt_.get_scaled_scan_status() / 4.0f;
		}